

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.hpp
# Opt level: O2

integer_format_info * __thiscall
toml::basic_value<toml::type_config>::as_integer_fmt(basic_value<toml::type_config> *this)

{
  allocator<char> local_31;
  string local_30;
  
  if (this->type_ == integer) {
    return (integer_format_info *)((long)&this->field_1 + 8);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_30,"toml::value::as_integer_fmt()",&local_31);
  throw_bad_cast(this,&local_30,integer);
}

Assistant:

integer_format_info const& as_integer_fmt() const
    {
        if(this->type_ != value_t::integer)
        {
            this->throw_bad_cast("toml::value::as_integer_fmt()", value_t::integer);
        }
        return this->integer_.format;
    }